

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void delta_encode_palette_colors(int *colors,int num,int bit_depth,int min_val,aom_writer *w)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int deltas [8];
  int local_58 [10];
  
  if (0 < num) {
    if (0 < bit_depth) {
      uVar7 = *colors;
      uVar8 = bit_depth + 1;
      do {
        od_ec_encode_bool_q15(&w->ec,(uint)((uVar7 >> (uVar8 - 2 & 0x1f) & 1) != 0),0x4000);
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    if (num != 1) {
      local_58[4] = 0;
      local_58[5] = 0;
      local_58[6] = 0;
      local_58[7] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      uVar2 = 2;
      if (2 < num) {
        uVar2 = (ulong)(uint)num;
      }
      iVar5 = *colors;
      lVar6 = 0;
      iVar3 = 0;
      iVar4 = iVar5;
      do {
        iVar1 = colors[lVar6 + 1];
        iVar4 = iVar1 - iVar4;
        local_58[lVar6] = iVar4;
        if (iVar4 <= iVar3) {
          iVar4 = iVar3;
        }
        iVar3 = iVar4;
        lVar6 = lVar6 + 1;
        iVar4 = iVar1;
      } while (uVar2 - 1 != lVar6);
      iVar4 = bit_depth + -3;
      uVar8 = iVar3 - min_val;
      uVar7 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      iVar3 = 0;
      if (1 < (int)(uVar8 + 1)) {
        iVar3 = (uVar7 ^ 0xffffffe0) + 0x21;
      }
      if (iVar3 <= iVar4) {
        iVar3 = iVar4;
      }
      uVar7 = 3;
      do {
        od_ec_encode_bool_q15
                  (&w->ec,(uint)(((uint)(iVar3 - iVar4) >> (uVar7 - 2 & 0x1f) & 1) != 0),0x4000);
        uVar7 = uVar7 - 1;
      } while (1 < uVar7);
      iVar4 = (1 << ((byte)bit_depth & 0x1f)) - (iVar5 + min_val);
      iVar5 = 2;
      if (2 < num) {
        iVar5 = num;
      }
      uVar2 = 0;
      do {
        iVar1 = local_58[uVar2];
        if (0 < iVar3) {
          uVar7 = iVar3 + 1;
          do {
            od_ec_encode_bool_q15
                      (&w->ec,(uint)(((uint)(iVar1 - min_val) >> (uVar7 - 2 & 0x1f) & 1) != 0),
                       0x4000);
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
        }
        iVar4 = iVar4 - iVar1;
        uVar7 = 0x1f;
        if (iVar4 - 1U != 0) {
          for (; iVar4 - 1U >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        iVar1 = (uVar7 ^ 0xffffffe0) + 0x21;
        if (iVar4 < 2) {
          iVar1 = 0;
        }
        if (iVar1 <= iVar3) {
          iVar3 = iVar1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 != iVar5 - 1);
    }
  }
  return;
}

Assistant:

static inline void delta_encode_palette_colors(const int *colors, int num,
                                               int bit_depth, int min_val,
                                               aom_writer *w) {
  if (num <= 0) return;
  assert(colors[0] < (1 << bit_depth));
  aom_write_literal(w, colors[0], bit_depth);
  if (num == 1) return;
  int max_delta = 0;
  int deltas[PALETTE_MAX_SIZE];
  memset(deltas, 0, sizeof(deltas));
  for (int i = 1; i < num; ++i) {
    assert(colors[i] < (1 << bit_depth));
    const int delta = colors[i] - colors[i - 1];
    deltas[i - 1] = delta;
    assert(delta >= min_val);
    if (delta > max_delta) max_delta = delta;
  }
  const int min_bits = bit_depth - 3;
  int bits = AOMMAX(av1_ceil_log2(max_delta + 1 - min_val), min_bits);
  assert(bits <= bit_depth);
  int range = (1 << bit_depth) - colors[0] - min_val;
  aom_write_literal(w, bits - min_bits, 2);
  for (int i = 0; i < num - 1; ++i) {
    aom_write_literal(w, deltas[i] - min_val, bits);
    range -= deltas[i];
    bits = AOMMIN(bits, av1_ceil_log2(range));
  }
}